

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RTree.h
# Opt level: O2

bool __thiscall
anurbs::RTree<2L>::PickByRay::operator()(PickByRay *this,Vector *box_min,Vector *box_max)

{
  Vector *this_00;
  double dVar1;
  double dVar2;
  double dVar3;
  Scalar SVar4;
  CoeffReturnType pdVar5;
  Scalar *pSVar6;
  double *pdVar7;
  Scalar *pSVar8;
  Index i_1;
  bool bVar9;
  Index i_2;
  ulong index;
  Index i;
  long lVar10;
  ulong index_00;
  bool bVar11;
  Vector coordinate;
  Vector max_t;
  Vector candidate_plane;
  VectorU quadrant;
  double local_a8;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  local_88 [16];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,_Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>_>
  local_78 [8];
  double local_70;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  local_68 [16];
  PlainObjectBase<Eigen::Matrix<unsigned_long,1,2,1,1,2>> local_58 [24];
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>_>
  local_40 [16];
  
  Eigen::DenseBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<unsigned_long,1,2,1,1,2>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<unsigned_long>,Eigen::Matrix<unsigned_long,1,2,1,1,2>>>
            (local_58,local_78);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>>>
            ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)local_78,local_68);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>>>
            ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)local_68,local_88);
  Eigen::DenseBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>_>::Zero();
  Eigen::PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>>::
  PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,1,2,1,1,2>>>
            ((PlainObjectBase<Eigen::Matrix<double,1,2,1,1,2>> *)local_88,local_40);
  bVar9 = true;
  for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this,lVar10);
    dVar1 = *pdVar5;
    pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_min,lVar10);
    if (*pdVar5 <= dVar1) {
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this,lVar10);
      dVar1 = *pdVar5;
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_max,lVar10
                         );
      if (*pdVar5 <= dVar1 && dVar1 != *pdVar5) {
        pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)
                            local_58,lVar10);
        *pSVar6 = 1;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_max,
                            lVar10);
        local_a8 = *pdVar5;
        pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_68,
                            lVar10);
        goto LAB_001c8054;
      }
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)
                          local_58,lVar10);
      *pSVar6 = 0;
    }
    else {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)
                          local_58,lVar10);
      *pSVar6 = 0xffffffffffffffff;
      pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_min,lVar10
                         );
      local_a8 = *pdVar5;
      pdVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_68,
                          lVar10);
LAB_001c8054:
      *pdVar7 = local_a8;
      bVar9 = false;
    }
  }
  bVar11 = true;
  if (!bVar9) {
    this_00 = &this->m_direction;
    for (lVar10 = 0; lVar10 != 2; lVar10 = lVar10 + 1) {
      pSVar6 = Eigen::DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<unsigned_long,_1,_2,_1,_1,_2>,_1> *)
                          local_58,lVar10);
      if (*pSVar6 == 0) {
LAB_001c812c:
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,
                            lVar10);
        *pSVar8 = -1.0;
      }
      else {
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this_00,
                            lVar10);
        if ((*pdVar5 == 0.0) && (!NAN(*pdVar5))) goto LAB_001c812c;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_68,
                            lVar10);
        dVar1 = *pSVar8;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this,lVar10)
        ;
        dVar2 = *pdVar5;
        pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this_00,
                            lVar10);
        dVar3 = *pdVar5;
        pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                           ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,
                            lVar10);
        *pSVar8 = (dVar1 - dVar2) / dVar3;
      }
    }
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,0);
    index_00 = (ulong)(*pSVar8 <= local_70 && local_70 != *pSVar8);
    pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                       ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,
                        index_00);
    if (0.0 < *pSVar8 || *pSVar8 == 0.0) {
      for (index = 0; bVar11 = index == 2, !bVar11; index = index + 1) {
        if (index_00 == index) {
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_68,
                              index_00);
          SVar4 = *pSVar8;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_88,
                              index_00);
          *pSVar8 = SVar4;
        }
        else {
          pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this,index
                             );
          dVar1 = *pdVar5;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_78,
                              index_00);
          dVar2 = *pSVar8;
          pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)this_00,
                              index);
          dVar3 = *pdVar5;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_88,
                              index);
          *pSVar8 = dVar2 * dVar3 + dVar1;
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_88,
                              index);
          dVar1 = *pSVar8;
          pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_min,
                              index);
          if (dVar1 < *pdVar5) {
            return bVar11;
          }
          pSVar8 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_1> *)local_88,
                              index);
          dVar1 = *pSVar8;
          pdVar5 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0>::operator[]
                             ((DenseCoeffsBase<Eigen::Matrix<double,_1,_2,_1,_1,_2>,_0> *)box_max,
                              index);
          if (*pdVar5 <= dVar1 && dVar1 != *pdVar5) {
            return bVar11;
          }
        }
      }
    }
    else {
      bVar11 = false;
    }
  }
  return bVar11;
}

Assistant:

bool operator()(const Vector box_min, const Vector box_max) const noexcept
        {
            // based on Fast Ray-Box Intersection
            // by Andrew Woo
            // from "Graphics Gems", Academic Press, 1990

            bool inside = true;
            VectorU quadrant = VectorU::Zero(); // FIXME: choose other type...
            int which_plane = 0;
            Vector max_t = Vector::Zero();
            Vector candidate_plane = Vector::Zero();
            Vector coordinate = Vector::Zero();

            for (Index i = 0; i < TDimension; i++) {
                if (m_origin[i] < box_min[i]) {
                    quadrant[i] = -1;
                    candidate_plane[i] = box_min[i];
                    inside = false;
                } else if (m_origin[i] > box_max[i]) {
                    quadrant[i] = 1;
                    candidate_plane[i] = box_max[i];
                    inside = false;
                } else {
                    quadrant[i] = 0;
                }
            }

            if (inside) {
                coordinate = m_origin;
                return true;
            }

            for (Index i = 0; i < TDimension; i++) {
                if (quadrant[i] != 0 && m_direction[i] != 0) {
                    max_t[i] = (candidate_plane[i] - m_origin[i]) / m_direction[i];
                } else {
                    max_t[i] = -1;
                }
            }

            which_plane = 0;
            
            for (Index i = 1; i < TDimension; i++) {
                if (max_t[which_plane] < max_t[i]) {
                    which_plane = i;
                }
            }

            if (max_t[which_plane] < 0) {
                return false;
            }

            for (Index i = 0; i < TDimension; i++) {
                if (which_plane != i) {
                    coordinate[i] = m_origin[i] + max_t[which_plane] * m_direction[i];
                    if (coordinate[i] < box_min[i] || coordinate[i] > box_max[i]) {
                        return false;
                    }
                } else {
                    coordinate[i] = candidate_plane[i];
                }
            }

            return true;
        }